

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

Sample * __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::renderSample
          (Sample *__return_storage_ptr__,RelativeChangeCase *this,RenderData *occluder,
          RenderData *occluded,int workload)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  deUint64 dVar6;
  undefined1 local_4c [4];
  deUint64 dStack_48;
  deUint8 buffer [4];
  deUint64 prev;
  deUint64 now;
  GLuint program;
  Functions *gl;
  int workload_local;
  RenderData *occluded_local;
  RenderData *occluder_local;
  RelativeChangeCase *this_local;
  long lVar5;
  
  iVar2 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  dVar3 = glu::ShaderProgram::getProgram(&occluded->m_program);
  dStack_48 = 0;
  (**(code **)(lVar5 + 0x1680))(dVar3);
  pcVar1 = *(code **)(lVar5 + 0x14f0);
  uVar4 = (**(code **)(lVar5 + 0xb48))(dVar3,"u_iterations");
  (*pcVar1)(uVar4,workload);
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x4e8))(0xb71);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dStack_48 = deGetMicroseconds();
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x4e8))(0xb71);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar6 = deGetMicroseconds();
  __return_storage_ptr__->nullTime = dVar6 - dStack_48;
  dStack_48 = deGetMicroseconds();
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x5e0))(0xb71);
  BaseCase::render(&this->super_BaseCase,occluder);
  BaseCase::render(&this->super_BaseCase,occluded);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar6 = deGetMicroseconds();
  __return_storage_ptr__->testTime = dVar6 - dStack_48;
  dStack_48 = deGetMicroseconds();
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x4e8))(0xb71);
  BaseCase::render(&this->super_BaseCase,occluder);
  BaseCase::render(&this->super_BaseCase,occluded);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar6 = deGetMicroseconds();
  __return_storage_ptr__->baseTime = dVar6 - dStack_48;
  __return_storage_ptr__->workload = 0;
  return __return_storage_ptr__;
}

Assistant:

Sample RelativeChangeCase::renderSample (const RenderData& occluder, const RenderData& occluded, int workload) const
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const GLuint			program	= occluded.m_program.getProgram();
	Sample					sample;
	deUint64				now		= 0;
	deUint64				prev	= 0;
	deUint8					buffer[4];

	gl.useProgram(program);
	gl.uniform1i(gl.getUniformLocation(program, "u_iterations"), workload);

	// Warmup (this workload seems to reduce variation in following workloads)
	{
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
		gl.disable(GL_DEPTH_TEST);

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	}

	// Null time
	{
		prev = deGetMicroseconds();

		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
		gl.disable(GL_DEPTH_TEST);

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		now = deGetMicroseconds();

		sample.nullTime = now - prev;
	}

	// Test time
	{
		prev = deGetMicroseconds();

		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
		gl.enable(GL_DEPTH_TEST);

		render(occluder);
		render(occluded);

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		now = deGetMicroseconds();

		sample.testTime = now - prev;
	}

	// Base time
	{
		prev = deGetMicroseconds();

		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
		gl.disable(GL_DEPTH_TEST);

		render(occluder);
		render(occluded);

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		now = deGetMicroseconds();

		sample.baseTime = now - prev;
	}

	sample.workload = 0;

	return sample;
}